

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testInvalid_TargetPredictedFeatureNameAndFakeModelInputs(void)

{
  bool bVar1;
  NeuralNetwork *nn;
  ModelDescription *pMVar2;
  FeatureType *pFVar3;
  DictionaryFeatureType *this;
  char *targetName;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar4;
  FeatureDescription *this_00;
  ArrayFeatureType *this_01;
  reference from;
  ostream *poVar5;
  Result local_2a8;
  FeatureDescription *trainingInputModel;
  FeatureDescription feature;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  int i_1;
  ArrayFeatureType *outTensorShape;
  FeatureDescription *outTensor;
  Result local_210;
  FeatureDescription *trainingInput2;
  ArrayFeatureType *trainingInputTensorShape;
  FeatureDescription *trainingInput;
  ArrayFeatureType *pAStack_1c8;
  int i;
  ArrayFeatureType *fakeModelInputShape;
  FeatureDescription *fakeModelInput;
  _Rb_tree_node_base _Stack_1b0;
  size_t sStack_190;
  set<long,_std::less<long>,_std::allocator<long>_> local_188;
  set<long,_std::less<long>,_std::allocator<long>_> local_158;
  allocator local_121;
  string local_120;
  FeatureDescription *outputProbs;
  FeatureDescription *output;
  undefined1 local_e8 [8];
  string probsName;
  NeuralNetwork *neuralNet;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  undefined1 local_68 [48];
  Model spec;
  
  CoreML::Specification::Model::Model((Model *)(local_68 + 0x28));
  CoreML::Result::Result((Result *)local_68);
  tensorAttributesOut._8_8_ = anon_var_dwarf_57e1f;
  neuralNet = (NeuralNetwork *)anon_var_dwarf_57e36;
  tensorAttributesOut.name = (char *)0x1;
  buildBasicNeuralNetworkModel
            ((Model *)(local_68 + 0x28),true,(TensorAttributes *)&tensorAttributesOut.dimension,
             (TensorAttributes *)&neuralNet,0x400,false,false);
  CoreML::Specification::Model::set_specificationversion((Model *)(local_68 + 0x28),4);
  nn = CoreML::Specification::Model::mutable_neuralnetwork((Model *)(local_68 + 0x28));
  addSoftmaxLayer((Model *)(local_68 + 0x28),"softmax","OutTensor","softmax_out");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&probsName._M_storage,"predictedFeatures",
             (allocator *)((long)&probsName.super__Rb_tree_node_base._M_right + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&probsName.super__Rb_tree_node_base._M_right + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_e8,"probs",(allocator *)((long)&output + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&output + 7));
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  outputProbs = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(outputProbs,(string *)&probsName._M_storage);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(outputProbs);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar3);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  local_120._M_storage._M_storage =
       (uchar  [8])CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)local_120._M_storage._M_storage,(string *)local_e8);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)local_120._M_storage._M_storage);
  CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar3);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)local_120._M_storage._M_storage);
  this = CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar3);
  CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(this);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  CoreML::Specification::ModelDescription::set_predictedfeaturename
            (pMVar2,(string *)&probsName._M_storage);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  CoreML::Specification::ModelDescription::set_predictedprobabilitiesname(pMVar2,(string *)local_e8)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"cce_target",&local_121);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  targetName = (char *)std::__cxx11::string::c_str();
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            ((Model *)(local_68 + 0x28),nn,"cross_entropy_loss_layer","softmax_out",targetName);
  addLearningRate<CoreML::Specification::NeuralNetwork>(nn,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_158._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_158._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_158._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_158._M_t._M_impl._0_8_ = 0;
  local_158._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_158._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_158);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>(nn,kSgdOptimizer,10,5,100,&local_158);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_158);
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_188._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_188._M_t._M_impl._0_8_ = 0;
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_188);
  addEpochs<CoreML::Specification::NeuralNetwork>(nn,100,1,100,&local_188);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_188);
  _Stack_1b0._M_right = (_Base_ptr)0x0;
  sStack_190 = 0;
  _Stack_1b0._M_parent = (_Base_ptr)0x0;
  _Stack_1b0._M_left = (_Base_ptr)0x0;
  fakeModelInput = (FeatureDescription *)0x0;
  _Stack_1b0._M_color = _S_red;
  _Stack_1b0._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&fakeModelInput);
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (nn,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&fakeModelInput);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&fakeModelInput);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  CoreML::Specification::ModelDescription::clear_traininginput(pMVar2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar2);
  fakeModelInputShape =
       (ArrayFeatureType *)
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(pRVar4);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)fakeModelInputShape,"madeUpInput");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)fakeModelInputShape);
  pAStack_1c8 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAStack_1c8,ArrayFeatureType_ArrayDataType_FLOAT32);
  for (trainingInput._4_4_ = 0; trainingInput._4_4_ < 3;
      trainingInput._4_4_ = trainingInput._4_4_ + 1) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAStack_1c8,1);
  }
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar2);
  trainingInputTensorShape =
       (ArrayFeatureType *)
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(pRVar4);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)trainingInputTensorShape,&local_120);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)trainingInputTensorShape);
  trainingInput2 =
       (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::set_datatype
            ((ArrayFeatureType *)trainingInput2,ArrayFeatureType_ArrayDataType_INT32);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)trainingInput2,1);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
  pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar2);
  local_210.m_message._M_storage._M_storage =
       (uchar  [8])
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add(pRVar4);
  CoreML::Specification::FeatureDescription::set_name
            ((FeatureDescription *)local_210.m_message._M_storage._M_storage,
             (string *)&probsName._M_storage);
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)local_210.m_message._M_storage._M_storage);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar3);
  CoreML::Model::validate(&local_210,(Model *)(local_68 + 0x28));
  CoreML::Result::operator=((Result *)local_68,&local_210);
  CoreML::Result::~Result(&local_210);
  bVar1 = CoreML::Result::good((Result *)local_68);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x728);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"!((res).good())");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    spec._oneof_case_[0] = 1;
  }
  else {
    pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
    CoreML::Specification::ModelDescription::clear_output(pMVar2);
    pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
    this_00 = CoreML::Specification::ModelDescription::add_output(pMVar2);
    CoreML::Specification::FeatureDescription::set_name(this_00,(char *)neuralNet);
    pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(this_00);
    this_01 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
    CoreML::Specification::ArrayFeatureType::set_datatype
              (this_01,ArrayFeatureType_ArrayDataType_FLOAT32);
    for (__range1._4_4_ = 0; __range1._4_4_ < (int)tensorAttributesOut.name;
        __range1._4_4_ = __range1._4_4_ + 1) {
      CoreML::Specification::ArrayFeatureType::add_shape(this_01,1);
    }
    pMVar2 = CoreML::Specification::Model::description((Model *)(local_68 + 0x28));
    pRVar4 = CoreML::Specification::ModelDescription::input(pMVar2);
    __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar4);
    feature._40_8_ =
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar4);
    while( true ) {
      bVar1 = google::protobuf::internal::
              RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                        (&__end1,(iterator *)&feature._cached_size_);
      if (!bVar1) break;
      from = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end1);
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&trainingInputModel,from);
      pMVar2 = CoreML::Specification::Model::mutable_description((Model *)(local_68 + 0x28));
      pRVar4 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar2);
      local_2a8.m_message._M_storage._M_storage =
           (uchar  [8])
           google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (pRVar4);
      CoreML::Specification::FeatureDescription::CopyFrom
                ((FeatureDescription *)local_2a8.m_message._M_storage._M_storage,
                 (FeatureDescription *)&trainingInputModel);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&trainingInputModel);
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end1);
    }
    CoreML::Model::validate(&local_2a8,(Model *)(local_68 + 0x28));
    CoreML::Result::operator=((Result *)local_68,&local_2a8);
    CoreML::Result::~Result(&local_2a8);
    bVar1 = CoreML::Result::good((Result *)local_68);
    if (bVar1) {
      spec._oneof_case_[0] = 0;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x73a);
      poVar5 = std::operator<<(poVar5,": error: ");
      poVar5 = std::operator<<(poVar5,"(res).good()");
      poVar5 = std::operator<<(poVar5," was false, expected true.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      spec._oneof_case_[0] = 1;
    }
  }
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)&probsName._M_storage);
  CoreML::Result::~Result((Result *)local_68);
  CoreML::Specification::Model::~Model((Model *)(local_68 + 0x28));
  return spec._oneof_case_[0];
}

Assistant:

int testInvalid_TargetPredictedFeatureNameAndFakeModelInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    // Model is not a classifier, but we'll describe these things in the spec anyway to check this edge-case
    std::string predictedFeatureName = "predictedFeatures";
    std::string probsName = "probs";
    auto *output = spec.mutable_description()->add_output();
    output->set_name(predictedFeatureName);
    output->mutable_type()->mutable_stringtype();

    auto *outputProbs = spec.mutable_description()->add_output();
    outputProbs->set_name(probsName);
    outputProbs->mutable_type()->mutable_dictionarytype();
    outputProbs->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    spec.mutable_description()->set_predictedfeaturename(predictedFeatureName);
    spec.mutable_description()->set_predictedprobabilitiesname(probsName);

    std::string targetName = "cce_target";
    addCategoricalCrossEntropyLoss(spec, neuralNet, "cross_entropy_loss_layer", "softmax_out", targetName.c_str());

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    // Clearing and then specifically adding only the target as a training input
    spec.mutable_description()->clear_traininginput();

    auto fakeModelInput = spec.mutable_description()->mutable_traininginput()->Add();
    fakeModelInput->set_name("madeUpInput");
    auto fakeModelInputShape = fakeModelInput->mutable_type()->mutable_multiarraytype();
    fakeModelInputShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < 3; i++) {
        fakeModelInputShape->add_shape(1);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    auto trainingInput2 = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput2->set_name(predictedFeatureName);
    trainingInput2->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);


    // Remove predictedFeatureName from model's outputs and add model's inputs to training inputs
    spec.mutable_description()->clear_output();
    auto outTensor = spec.mutable_description()->add_output();
    outTensor->set_name(tensorAttributesOut.name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < tensorAttributesOut.dimension; i++) {
        outTensorShape->add_shape(1);
    }

    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}